

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void out_init_log(out_stream_info *stream)

{
  out_stream_info *in_RDI;
  
  out_state_init(in_RDI);
  in_RDI->do_print = do_log_print;
  in_RDI->plain_text_target = 1;
  return;
}

Assistant:

static void out_init_log(out_stream_info *stream)
{
    /* initialize the basic stream state */
    out_state_init(stream);

    /* set up the low-level output routine */
    stream->do_print = do_log_print;

    /* use plain text in the log file stream */
    stream->plain_text_target = TRUE;
}